

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O0

int get_random_numbers(uint64_t *buffer,size_t count,uint64_t b)

{
  undefined1 auVar1 [16];
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  ulong in_RDX;
  size_t in_RSI;
  void *in_RDI;
  size_t i;
  int err;
  FILE *f;
  uint64_t bad;
  ulong local_40;
  int local_34;
  int local_4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RDX;
  __stream = fopen("/dev/urandom","r");
  if (__stream == (FILE *)0x0) {
    local_4 = -1;
  }
  else {
    sVar3 = fread(in_RDI,8,in_RSI,__stream);
    local_34 = (int)in_RSI - (int)sVar3;
    for (local_40 = 0; local_40 < in_RSI; local_40 = local_40 + 1) {
      while (-SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) % auVar1,0) - 1U <=
             *(ulong *)((long)in_RDI + local_40 * 8)) {
        sVar3 = fread((void *)((long)in_RDI + local_40 * 8),8,1,__stream);
        local_34 = local_34 + (1 - (int)sVar3);
      }
      *(ulong *)((long)in_RDI + local_40 * 8) = *(ulong *)((long)in_RDI + local_40 * 8) % in_RDX;
    }
    iVar2 = fclose(__stream);
    local_4 = -(local_34 - iVar2);
  }
  return local_4;
}

Assistant:

int get_random_numbers(uint64_t buffer[], size_t count, uint64_t b) {

    #if defined(__linux__) || defined(__APPLE__)

        uint64_t bad = UINT64_MAX - (UINT64_MAX % b);
        FILE* f = fopen("/dev/urandom", "r");
        if(f == NULL)
            return -1;
        int err = 0;
        err += count - fread(buffer, sizeof(uint64_t), count, f);
        for(size_t i = 0; i < count; i++) {
            while(buffer[i] >= bad) {
                err += 1 - fread(&(buffer[i]), sizeof(uint64_t), 1, f);
            }
            buffer[i] %= b;
        }
        err -= fclose(f);
        return -err;

    #elif _WIN32

        uint64_t bad = UINT64_MAX - (UINT64_MAX % b);
        HMODULE hmod = LoadLibrary("advapi32.dll");
        if(hmod == NULL)
            return -1;
        BOOLEAN (APIENTRY* RtlGenRandom_ptr)(PVOID, ULONG) = (BOOLEAN (APIENTRY*)(PVOID, ULONG)) GetProcAddress(hmod, "SystemFunction036");
        if(!RtlGenRandom_ptr) {
            FreeLibrary(hmod);
            return -1;
        }
        int err = 0;
        if(!RtlGenRandom_ptr(buffer, count * sizeof(uint64_t)))
            err++;
        for(size_t i = 0; i < count; i++) {
            while(buffer[i] >= bad) {
                if(!RtlGenRandom_ptr(&(buffer[i]), sizeof(uint64_t)))
                    err++;
            }
            buffer[i] %= b;
        }
        if(!FreeLibrary(hmod))
            err++;
        return -err;

    #endif

}